

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O0

bool AString_replaceAString(AString *str,AString *old,AString *rep,size_t count)

{
  size_t count_local;
  AString *rep_local;
  AString *old_local;
  AString *str_local;
  
  if (old == (AString *)0x0) {
    str_local._4_4_ = false;
  }
  else if (rep == (AString *)0x0) {
    str_local._4_4_ = AString_replaceCString(str,old->buffer,old->size,(char *)0x0,0,count);
  }
  else {
    str_local._4_4_ = AString_replaceCString(str,old->buffer,old->size,rep->buffer,rep->size,count);
  }
  return str_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC bool AString_replaceAString(struct AString *str, const struct AString *old, const struct AString *rep, size_t count)
{
    if(old == nullptr)
        return false;
    else if(rep == nullptr)
        return AString_replaceCString(str, old->buffer, old->size, nullptr, 0, count);
    else
        return AString_replaceCString(str, old->buffer, old->size, rep->buffer, rep->size, count);
}